

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O2

void __thiscall polyscope::SlicePlane::ensureVolumeInspectValid(SlicePlane *this)

{
  bool bVar1;
  __shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2> local_58;
  string local_40;
  
  if (this->shouldInspectMesh == true) {
    std::__cxx11::string::string((string *)&local_40,(string *)&this->inspectedMeshName);
    bVar1 = hasVolumeMesh(&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if (!bVar1) {
      std::__cxx11::string::assign((char *)&this->inspectedMeshName);
      this->shouldInspectMesh = false;
      local_58._M_ptr = (element_type *)0x0;
      local_58._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->volumeInspectProgram).
                  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>,
                 &local_58);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
    }
  }
  return;
}

Assistant:

void SlicePlane::ensureVolumeInspectValid() {
  if (!shouldInspectMesh) return;

  // This method exists to save us in any cases where we might be inspecting a volume mesh when that mesh is deleted. We
  // can't just call setVolumeMeshToInspect(""), because that tries to look up the volume mesh.

  if (!hasVolumeMesh(inspectedMeshName)) {
    inspectedMeshName = "";
    shouldInspectMesh = false;
    volumeInspectProgram = nullptr;
  }
}